

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O2

Score Search::search<(Nodetype)2>(position *pos,int16 alpha,int16 beta,U16 depth,node *stack)

{
  int *piVar1;
  Searchthread *t;
  U64 UVar2;
  Score SVar3;
  U8 UVar4;
  U8 UVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  U16 depth_00;
  int iVar12;
  uint uVar13;
  long lVar14;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar15;
  undefined6 in_register_0000000a;
  ulong uVar16;
  ushort uVar17;
  undefined8 extraout_RDX;
  undefined8 uVar18;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined7 uVar19;
  uint uVar20;
  Score SVar21;
  byte bVar22;
  byte bVar23;
  short sVar24;
  uint uVar25;
  Score SVar26;
  bool bVar27;
  Score SVar28;
  short sVar29;
  bool bVar30;
  float __x;
  Move move;
  Score local_22c;
  Move local_226;
  Move local_223;
  int local_220;
  undefined4 local_21c;
  uint local_218;
  int local_214;
  uint local_210;
  Score local_20c;
  char local_207;
  byte local_206;
  bool pvNode;
  Score local_204;
  Score local_200;
  Move local_1fa;
  Move local_1f7;
  uint local_1f4;
  Score local_1f0;
  Score bestScore;
  undefined4 local_1e8;
  uint local_1e4;
  Score ttvalue;
  U8 local_1db;
  U8 local_1da;
  U8 local_1d9;
  node *local_1d8;
  ulong local_1d0;
  U64 local_1c8;
  int local_1bc;
  uint local_1b8;
  Score local_1b4;
  Score local_1b0;
  int16 local_1aa;
  Move *local_1a8;
  ulong local_1a0;
  vector<Move,_std::allocator<Move>_> quiets;
  Moveorder mvs;
  Move pv [68];
  
  if (UCI_SIGNALS.stop) {
    return draw;
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DoubleEspresso[P]chess/src/search.hpp"
                  ,0x139,
                  "Score Search::search(position &, int16, int16, U16, node *) [type = non_pv]");
  }
  local_218 = (uint)CONCAT62(in_register_0000000a,depth);
  SVar28 = (Score)alpha;
  local_223.f = '\0';
  local_223.t = '\0';
  bestScore = ninf;
  local_223.type = '\x11';
  local_226.f = '\0';
  local_226.t = '\0';
  local_226.type = '\x11';
  lVar14 = 2;
  do {
    *(undefined2 *)((long)pv + lVar14 + -2) = 0;
    (&pv[0].f)[lVar14] = '\x11';
    lVar14 = lVar14 + 3;
  } while (lVar14 != 0xce);
  ttvalue = ninf;
  bVar6 = position::in_check(pos);
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  stack->in_check = bVar6;
  iVar12 = *(int *)(stack + -1);
  stack->ply = (U16)(iVar12 + 1U);
  pvNode = false;
  if (!bVar6) {
    bVar7 = position::is_draw(pos);
    SVar26 = draw;
    if (bVar7) goto LAB_00126f2d;
  }
  uVar20 = iVar12 + 1U & 0xffff;
  SVar26 = mate - uVar20;
  SVar3 = (int)beta;
  if (SVar26 < beta) {
    SVar3 = SVar26;
  }
  if (SVar26 <= SVar28) goto LAB_00126f2d;
  SVar21 = uVar20 + mated;
  local_1f0 = SVar28;
  if (SVar28 < SVar21) {
    local_1f0 = SVar21;
  }
  sVar29 = (short)SVar3;
  SVar26 = SVar21;
  if (sVar29 <= SVar21) goto LAB_00126f2d;
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
       '\x11';
  local_1c8 = (pos->ifo).key;
  local_20c = (int)sVar29;
  bVar7 = hash_table::fetch(&ttable,&local_1c8,(hash_data *)&mvs);
  SVar28 = ninf;
  local_1d0 = (ulong)(ushort)local_218;
  if (bVar7) {
    local_226 = mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._2_3_;
    hashHits = hashHits + 1;
    SVar28 = (Score)mvs._vptr_Moveorder._4_2_;
    local_1d0._0_4_ = local_218 & 0xffff;
    ttvalue = SVar28;
    if ((int)(uint)local_1d0 <= (int)(char)mvs._vptr_Moveorder) {
      if (SVar28 < local_20c) {
        if (mvs._vptr_Moveorder._1_1_ == '\x01') {
LAB_0012661b:
          local_1c8 = CONCAT62(local_1c8._2_6_,(ushort)local_218);
          position::stats_update
                    (pos,&local_226,&stack[-1].curr_move,(int16 *)&local_1c8,&ttvalue,&quiets,
                     stack->killers);
          SVar26 = ttvalue;
          goto LAB_00126f2d;
        }
      }
      else if (mvs._vptr_Moveorder._1_1_ == '\0') goto LAB_0012661b;
    }
  }
  bVar7 = position::pawns_near_promotion(pos);
  position::pawns_on_7th(pos);
  if (SVar28 == ninf) {
    SVar28 = stack[-2].static_eval;
    if ((SVar28 != ninf && !bVar6) && (stack[-1].static_eval <= SVar28)) {
      SVar28 = SVar28 + 0xf;
      goto LAB_001266fa;
    }
    if (!bVar6) {
      t = SearchThreads.workers.super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
          _M_impl.super__Vector_impl_data._M_start[pos->thread_id];
      mvs._vptr_Moveorder._0_4_ = lazy_eval_margin_search((int)local_1d0,bVar7);
      __x = eval::evaluate(pos,t,(float *)&mvs);
      lVar14 = lroundf(__x);
      SVar28 = (Score)lVar14;
      stack->static_eval = SVar28;
      goto LAB_00126703;
    }
    stack->static_eval = ninf;
    SVar28 = ninf;
LAB_00126713:
    bVar27 = false;
  }
  else {
LAB_001266fa:
    stack->static_eval = SVar28;
    if (bVar6) goto LAB_00126713;
LAB_00126703:
    if ((stack[-1].curr_move.type != '\n') || (stack->null_search != false)) goto LAB_00126713;
    bVar27 = (((short)(undefined2)local_1f0 - local_20c) + 1U & 0xfffffffdU) == 0 && SVar28 != ninf;
  }
  if ((pos->ifo).stm == white) {
    bVar8 = position::non_pawn_material<(Color)0>(pos);
  }
  else {
    bVar8 = position::non_pawn_material<(Color)1>(pos);
  }
  if (((bVar27 & bVar8 & 5 < (ushort)local_218) == 1) &&
     (local_20c <= SVar28 + (int)local_1d0 * 8 + 0xfffffe00)) {
    stack[1].null_search = true;
    position::do_null_move(pos);
    depth_00 = (short)local_218 - (short)(local_1d0 >> 1);
    if ((short)depth_00 < 2) {
      SVar28 = qsearch<(Nodetype)2>(pos,-sVar29,1 - sVar29,0,stack + 1);
    }
    else {
      SVar28 = search<(Nodetype)2>(pos,-sVar29,1 - sVar29,depth_00,stack + 1);
    }
    position::undo_null_move(pos);
    SVar26 = -SVar28;
    stack[1].null_search = false;
    if (local_20c == SVar26 || SBORROW4(local_20c,SVar26) != local_20c + SVar28 < 0)
    goto LAB_00126f2d;
    if ((stack[1].best_move.type == '\v') && (499 < SVar28 + local_20c)) {
      UVar4 = stack[1].best_move.t;
      (stack->threat_move).f = stack[1].best_move.f;
      (stack->threat_move).t = UVar4;
      (stack->threat_move).type = '\v';
    }
  }
  haVoc::Moveorder::Moveorder(&mvs,pos,&local_226,stack);
  move.f = '\0';
  move.t = '\0';
  move.type = '\x11';
  local_1f7.f = stack[-1].curr_move.f;
  local_1f7.t = stack[-1].curr_move.t;
  local_1f7.type = stack[-1].curr_move.type;
  local_1fa.f = stack[-2].curr_move.f;
  local_1fa.t = stack[-2].curr_move.t;
  local_1fa.type = stack[-2].curr_move.type;
  local_1b0 = stack[-2].static_eval;
  local_1b4 = stack->static_eval;
  local_1a0 = (ulong)(pos->ifo).stm;
  uVar20 = (uint)(pos->ifo).key & 0x3ff;
  if (searching_positions[uVar20].searching == false) {
    uVar17 = pos->thread_id;
    searching_positions[uVar20].searching = true;
    searching_positions[uVar20].id = (uint)uVar17;
  }
  bVar27 = local_1b0 <= local_1b4;
  local_1a8 = stack->killers;
  local_204 = (Score)(short)local_1f0;
  uVar15 = (uint)local_1d0;
  local_1b8 = uVar15 * uVar15 + 6 >> (local_1b4 < local_1b0);
  uVar20 = 0x3f;
  if (uVar15 < 0x3f) {
    uVar20 = uVar15;
  }
  local_1d8 = stack + 1;
  local_1bc = -local_1f0;
  local_1f0 = ~local_1f0;
  sVar29 = -sVar29;
  local_22c = ninf;
  bVar8 = false;
  local_1f4 = 0;
  do {
    local_206 = (ushort)local_218 < 2 && local_22c < local_204;
    local_207 = mated_max_ply < local_22c && local_22c < local_204;
    local_200 = local_22c;
    do {
      bVar9 = 1 < (ushort)local_1f4 & local_206;
      do {
        do {
          bVar10 = haVoc::Moveorder::next_move
                             (&mvs,pos,&move,&local_1f7,&local_1fa,&stack->threat_move,bVar8,false);
          if (!bVar10) goto LAB_00126e00;
          if (UCI_SIGNALS.stop != false) goto LAB_00126ecf;
        } while ((move.type == '\x11') || (bVar10 = position::is_legal(pos,&move), !bVar10));
        uVar18 = extraout_RDX;
        if ((move.f == local_226.f) && (move.t == local_226.t)) {
          uVar18 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          local_21c = (undefined4)uVar18;
          if (move.type != local_226.type) goto LAB_00126946;
        }
        else {
LAB_00126946:
          if ((move.f == local_1a8->f) && (move.t == stack->killers[0].t)) {
            uVar18 = CONCAT71((int7)((ulong)uVar18 >> 8),1);
            local_21c = (undefined4)uVar18;
            if (move.type == stack->killers[0].type) goto LAB_001269ca;
          }
          if ((move.f == stack->killers[1].f) && (move.t == stack->killers[1].t)) {
            uVar18 = CONCAT71((int7)((ulong)uVar18 >> 8),1);
            local_21c = (undefined4)uVar18;
            if (move.type == stack->killers[1].type) goto LAB_001269ca;
          }
          if (((move.f != stack->killers[2].f) || (move.t != stack->killers[2].t)) ||
             (local_21c = (undefined4)CONCAT71((int7)((ulong)uVar18 >> 8),1),
             move.type != stack->killers[2].type)) {
            if ((move.f == stack->killers[3].f) && (move.t == stack->killers[3].t)) {
              local_21c = (undefined4)CONCAT71(extraout_var,move.type == stack->killers[3].type);
            }
            else {
              local_21c = 0;
            }
          }
        }
LAB_001269ca:
        bVar10 = position::is_promotion(pos,&move.type);
        local_210 = CONCAT31(local_210._1_3_,1);
        uVar18 = extraout_RDX_00;
        if (1 < (byte)(move.type - 0xb)) {
          local_1c8 = CONCAT44(local_1c8._4_4_,(uint)move.type);
          bVar11 = position::is_cap_promotion(pos,(Movetype *)&local_1c8);
          local_210 = CONCAT31(local_210._1_3_,bVar11);
          uVar18 = extraout_RDX_01;
        }
        if ((pos->pcs).piece_on._M_elems[move.t] == pawn) {
          uVar19 = (undefined7)((ulong)uVar18 >> 8);
          if (local_1a0 == 0) {
            local_220 = (int)CONCAT71(uVar19,0x27 < move.t);
          }
          else {
            local_220 = (int)CONCAT71(uVar19,move.t < 0x18);
          }
        }
        else {
          local_220 = 0;
        }
        if ((stack->threat_move).type == '\x11') {
          local_1e4 = 0;
        }
        else {
          local_1e4 = (uint)((stack->threat_move).f == move.t & (byte)local_210);
        }
        local_214 = CONCAT31(local_214._1_3_,stack[-1].curr_move.type);
        if (move.type == '\n') {
          bVar11 = position::quiet_gives_dangerous_check(pos,&move);
          local_1e8 = (undefined4)CONCAT71(extraout_var_00,bVar11);
        }
        else {
          local_1e8 = 0;
        }
      } while (((((!bVar6 && (byte)local_21c == '\0') && (byte)local_210 == '\x01') && !bVar10) &&
               (bVar9 == 1)) && (iVar12 = position::see(pos,&move), iVar12 < 0));
      bVar30 = (char)local_214 == '\v';
      position::do_move(pos,&move);
      (stack->curr_move).f = move.f;
      (stack->curr_move).t = move.t;
      (stack->curr_move).type = move.type;
      bVar11 = position::in_check(pos);
      uVar17 = (ushort)bVar11;
      bVar22 = local_1b0 <= local_1b4 | (byte)local_21c;
      bVar23 = 2 < (ushort)local_218 | (byte)local_210;
      bVar9 = (byte)local_220;
      if (bVar22 == 0 && bVar23 == 0) {
        uVar17 = bVar11 + 1;
        if (((bVar9 | (byte)local_1e8 | (byte)local_1e4) & 1) == 0) {
          uVar17 = (ushort)bVar11;
        }
        if (local_207 == '\0') {
          uVar17 = (ushort)bVar11;
        }
      }
      uVar15 = local_1f4 & 0xffff;
      bVar8 = local_1b8 <= uVar15;
      stack[1].pv = (Move *)0x0;
      uVar25 = uVar17 + local_218 +
               (int)(short)((byte)(((bVar10 || bVar11) || local_204 < local_200) |
                                  bVar22 | bVar6 | bVar23 | bVar9) | 0xfffe);
      local_220 = (int)sVar29;
      local_214 = (int)(short)local_1bc;
      sVar24 = (short)uVar25;
      if ((ushort)local_1f4 < 3) {
        stack[1].pv = pv;
        pv[0].f = '\0';
        pv[0].t = '\0';
        pv[0].type = '\x11';
        if (sVar24 < 2) {
          local_22c = qsearch<(Nodetype)1>(pos,sVar29,(short)local_1bc,0,local_1d8);
        }
        else {
          local_22c = search<(Nodetype)1>(pos,sVar29,(short)local_1bc,sVar24 - 1,local_1d8);
        }
LAB_00126d3b:
        local_22c = -local_22c;
      }
      else {
        uVar13 = uVar25;
        if (((((!bVar10 &&
               ((bVar9 | (byte)local_21c | (byte)local_1e4 | (byte)local_1e8 | (ushort)local_218 < 3
                         | bVar7) & 1) == 0) && !bVar6) && ((byte)local_210 & bVar30) == 0) &&
             !bVar11) && (local_200 <= local_204)) {
          uVar16 = (ulong)uVar15;
          if (0x3e < uVar15) {
            uVar16 = 0x3f;
          }
          uVar13 = (uint)(ushort)(sVar24 - *(short *)((long)&bitboards::reductions +
                                                     uVar16 * 4 +
                                                     (ulong)(uVar20 << 8) + (ulong)bVar27 * 0x4000))
          ;
        }
        local_210 = uVar25;
        if ((short)uVar13 < 2) {
          SVar28 = qsearch<(Nodetype)2>(pos,(undefined2)local_1f0,(short)local_1bc,0,local_1d8);
        }
        else {
          SVar28 = search<(Nodetype)2>(pos,(undefined2)local_1f0,(short)local_1bc,(short)uVar13 - 1,
                                       local_1d8);
        }
        local_22c = -SVar28;
        if (SBORROW4(local_204,local_22c) != local_204 + SVar28 < 0) {
          stack[1].pv = pv;
          pv[0].f = '\0';
          pv[0].t = '\0';
          pv[0].type = '\x11';
          if ((short)local_210 < 2) {
            local_22c = qsearch<(Nodetype)1>(pos,(int16)local_220,(int16)local_214,0,local_1d8);
          }
          else {
            local_22c = search<(Nodetype)1>(pos,(int16)local_220,(int16)local_214,
                                            (short)local_210 - 1,local_1d8);
          }
          goto LAB_00126d3b;
        }
      }
      if (move.type == '\n') {
        std::vector<Move,std::allocator<Move>>::emplace_back<Move&>
                  ((vector<Move,std::allocator<Move>> *)&quiets,&move);
      }
      position::undo_move(pos,&move);
      if (UCI_SIGNALS.stop != false) {
LAB_00126ecf:
        SVar26 = draw;
        goto LAB_00126f20;
      }
      local_1f4 = local_1f4 + 1;
    } while (local_22c <= local_200);
    bestScore = local_22c;
    UVar4 = move.f;
    UVar5 = move.t;
    local_223.f = move.f;
    local_223.t = move.t;
    local_223.type = move.type;
    (stack->best_move).f = UVar4;
    (stack->best_move).t = UVar5;
    (stack->best_move).type = move.type;
  } while (local_22c < local_20c);
  local_1c8 = CONCAT62(local_1c8._2_6_,(short)local_218);
  position::stats_update
            (pos,&local_223,&stack[-1].curr_move,(int16 *)&local_1c8,&bestScore,&quiets,local_1a8);
  local_200 = bestScore;
LAB_00126e00:
  UVar2 = (pos->ifo).key;
  uVar20 = (uint)UVar2 & 0x3ff;
  searching_positions[uVar20].searching = false;
  searching_positions[uVar20].id = -1;
  if ((local_204 <= local_200) && (local_200 < local_20c)) {
    if (local_223.f != local_223.t) {
      piVar1 = stack->bestMoveHistory->bm[local_1a0][local_223.f] + local_223.t;
      *piVar1 = *piVar1 + (int)local_1d0 * 2;
    }
  }
  if ((ushort)local_1f4 == 0) {
    SVar26 = draw;
    if (bVar6) {
      SVar26 = SVar21;
    }
  }
  else {
    local_1d9 = (U8)local_218;
    local_1da = local_200 < local_20c;
    local_1db = (U8)stack->ply;
    local_1aa = (int16)local_200;
    local_1c8 = UVar2;
    hash_table::save(&ttable,&local_1c8,&local_1d9,&local_1da,&local_1db,&local_223,&local_1aa,
                     &pvNode);
    SVar26 = bestScore;
  }
LAB_00126f20:
  haVoc::Moveorder::~Moveorder(&mvs);
LAB_00126f2d:
  std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
            (&quiets.super__Vector_base<Move,_std::allocator<Move>_>);
  return SVar26;
}

Assistant:

Score Search::search(position& pos, int16 alpha, int16 beta, U16 depth, node* stack) {

	if (UCI_SIGNALS.stop)
		return Score::draw;

	assert(alpha < beta);

	Score bestScore = Score::ninf;
	Move best_move = {};
	best_move.type = Movetype::no_type;
	size_t deferred = 0;

	Move ttm = {}; ttm.type = Movetype::no_type; // refactor me
	Move pv[Depth::MAX_PLY + 4];
	Score ttvalue = Score::ninf;

	bool in_check = pos.in_check();
	std::vector<Move> quiets;
	stack->in_check = in_check;
	stack->ply = (stack - 1)->ply + 1;


	U16 root_dist = stack->ply;
	const bool root_node = (type == Nodetype::root && stack->ply == 1);
	const bool pvNode = (root_node || type == Nodetype::pv);
	if (pvNode && selDepth < stack->ply + 1 && main_thread(pos))
		selDepth++;

	if (!root_node && !in_check && pos.is_draw())
			return Score::draw;

	{ // mate distance pruning
		Score mating_score = Score(Score::mate - root_dist);
		beta = std::min(mating_score, Score(beta));
		if (alpha >= mating_score)
			return mating_score;

		Score mated_score = Score(Score::mated + root_dist);
		alpha = std::max(mated_score, Score(alpha));
		if (beta <= mated_score)
			return mated_score;
	}

	// hashtable lookup
	auto hashHit = false;
	{
		hash_data e;
		hashHit = ttable.fetch(pos.key(), e);
		if (hashHit) {
			ttm = e.move;
			hashHits++;
			ttvalue = Score(e.score);
			if (!pvNode &&
				e.depth >= depth &&
				(ttvalue >= beta ? e.bound == bound_low : e.bound == bound_high)) {
				pos.stats_update(ttm, (stack - 1)->curr_move, depth, ttvalue, quiets, stack->killers);
				return ttvalue;
			}
		}
	}

	// static evaluation
	const bool anyPawnsOn7th = pos.pawns_near_promotion(); // either side has pawns on 7th
	const bool weHavePawnsOn7th = pos.pawns_on_7th(); // only side to move has pawns on 7th

	Score static_eval = (ttvalue != Score::ninf ? ttvalue :
		(stack-2)->static_eval != ninf && !in_check && (stack-2)->static_eval >= (stack-1)->static_eval ? Score((stack-2)->static_eval + 15) :
		!in_check ? 
		Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th)))) :
		Score::ninf);
	 
	//Score static_eval = Score::ninf;
	//if (ttvalue == Score::ninf &&
	//	!pvNode && 
	//	!in_check && 
	//	(stack - 2)->static_eval != Score::ninf &&
	//	(stack - 1)->best_move.type == Movetype::quiet)
	//	static_eval = Score((stack - 2)->static_eval + 33);
	//else if (!in_check)
	//	static_eval = Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th))));
	stack->static_eval = static_eval;
	bool hasStaticValue = static_eval != Score::ninf;


	// 0. Define the forward pruning conditions
	const bool forward_prune =
		(!in_check &&
		!pvNode &&
		(stack - 1)->curr_move.type == Movetype::quiet &&
		!stack->null_search &&
		abs(alpha - beta) == 1 && // only prune in null windows (same condition as !pv_node)
		hasStaticValue);

	// 1. Futility pruning
	//if (forward_prune &&
	//	!weHavePawnsOn7th &&
	//	depth <= 1 &&
	//	static_eval > mated_max_ply &&
	//	static_eval + 1150 < alpha)
	//	return Score(static_eval);

	// 2. Null move pruning
	bool null_move_allowed = (pos.to_move() == white ?
		pos.non_pawn_material<white>() :
		pos.non_pawn_material<black>());
	if (forward_prune &&
		null_move_allowed &&
		depth >= 6 &&
		static_eval - 8 * (64 - depth) >= beta) {

		int16 R = (depth >= 6 ? depth / 2 : 2);
		int16 ndepth = depth - R;

		(stack + 1)->null_search = true;
		pos.do_null_move();
		Score null_eval = Score(ndepth <= 1 ?
			-qsearch<non_pv>(pos, -beta, -beta + 1, 0, stack + 1) :
			-search<non_pv>(pos, -beta, -beta + 1, ndepth, stack + 1));
		pos.undo_null_move();
		(stack + 1)->null_search = false;


		// verification
		//null_eval = Score(ndepth <= 1 ?
		//	qsearch<non_pv>(pos, beta-1, beta, 0, stack) :
		//	search<non_pv>(pos, beta-1, beta, ndepth, stack));

		if (null_eval >= beta)
			return Score(null_eval);
		else {
			Move tm = (stack + 1)->best_move;
			if (tm.type == Movetype::capture && beta - null_eval >= 500)
				stack->threat_move = tm;
		}
	}

	// Main search
	U16 moves_searched = 0;
	haVoc::Moveorder mvs(pos, ttm, stack);
	Move move;
	Move pre_move = (stack - 1)->curr_move;
	Move pre_pre_move = (stack - 2)->curr_move;
	bool improving = stack->static_eval - (stack - 2)->static_eval >= 0;
	auto to_mv = pos.to_move();
	int SEE = 0;
	auto skipQuiets = false;
	auto rootMoves = root_node && pos.root_moves[0].pv.size() > 4;

	set_searching(pos, {}, pos.id());

	while (mvs.next_move(pos, move, pre_move, pre_pre_move, stack->threat_move, skipQuiets, rootMoves)) {

		if (UCI_SIGNALS.stop)
			return Score::draw;

		if (move.type == Movetype::no_type || !pos.is_legal(move))
			continue;


		if (main_thread(pos) && root_node && elapsed > 3000)
			std::cout << "info depth " << depth
			<< " currmove " << uci::move_to_string(move)
			<< " currmovenumber " << moves_searched << std::endl;

		// Set move data
		auto hashOrKiller = (move == ttm) ||
			(move == stack->killers[0]) ||
			(move == stack->killers[1]) ||
			(move == stack->killers[2]) ||
			(move == stack->killers[3]);
		auto isPromotion = pos.is_promotion(move.type);
		auto isCapture =
			(move.type == Movetype::capture) ||
			(move.type == Movetype::ep) ||
			pos.is_cap_promotion(Movetype(move.type));
		auto isQuiet = move.type == Movetype::quiet;
		auto isEvasion = in_check;
		auto advancedPawnPush = (pos.piece_on(Square(move.t)) == Piece::pawn) &&
			(to_mv == white ? util::row(move.t) >= Row::r6 : util::row(move.t) <= Row::r3);
		auto quietFollowingCapture = (stack - 1)->curr_move.type == Movetype::capture && isQuiet;
		auto quietFollowup = (stack - 1)->curr_move.type == Movetype::quiet && isQuiet;
		auto captureFollowup = (stack - 1)->curr_move.type == Movetype::capture && isCapture;
		auto threatResponse = (stack->threat_move.type != Movetype::no_type && stack->threat_move.f == move.t) && isCapture;
		auto dangerousQuietCheck = isQuiet && pos.quiet_gives_dangerous_check(move);

		// 4. Skip moves with negative see scores
		if (isCapture &&
			!hashOrKiller &&
			!pvNode &&
			!isEvasion &&
			!isPromotion &&
			bestScore < alpha &&
			depth <= 1 &&
			moves_searched > 1 &&
			(SEE = pos.see(move)) < 0)
			continue;

		// Debug viz readout
		//{
		//	std::unique_lock<std::mutex> lock(search_mtx);
		//	std::cout << "moveReadout " <<
		//		"depth=" << depth <<
		//		" m=" << (pos.to_move() == white ? "W" : "B") << "|" <<
		//		SanPiece[pos.piece_on(Square(move.f))] << "|" <<
		//		util::col(move.f) << "|" << util::row(move.f) << "|" <<
		//		util::col(move.t) << "|" << util::row(move.t) << std::endl;
		//}
		
		pos.do_move(move);
		stack->curr_move = move;

		bool givesCheck = pos.in_check();
		int16 extensions = givesCheck;
		int16 reductions = 1;

		// 5. Reduce uninteresting quiet moves
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			!isEvasion &&
			!givesCheck &&
			!isPromotion &&
			!advancedPawnPush &&
			depth <= 2 &&
			bestScore <= alpha)
			reductions += 1;

		// 6. Extend likely interesting quiet moves 
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			depth <= 2 &&
			bestScore < alpha &&
			bestScore > mated_max_ply &&
			(dangerousQuietCheck || advancedPawnPush || threatResponse))
			extensions += 1;

		// 7. Reduce losing captures
		//if (isCapture &&
		//	!hashOrKiller &&
		//	!givesCheck &&
		//	!isPromotion &&
		//	!isEvasion &&
		//	bestScore < alpha &&
		//	!advancedPawnPush &&
		//	depth <= 1 &&
		//	SEE < 0)
		//	reductions += 1;

		// 8. Movecount pruning from Stockfish
		skipQuiets = moves_searched >= futility_move_count(improving, depth);

		// 9. Reduction if this position is being searched by another thread
		//if (is_searching(pos, move, pos.id()))
		//	reductions += 1;

		int16 newdepth = depth + extensions - reductions;
		(stack + 1)->pv = nullptr;

		Score score = Score::ninf;
		if (moves_searched < 3) {
			(stack + 1)->pv = pv;
			(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);
			score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
				-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
		}
		else {
			int16 LMR = newdepth;
			// Late move reduction for moves unlikely to raise alpha
			if (!threatResponse &&
				!hashOrKiller &&
				!dangerousQuietCheck &&
				!captureFollowup &&
				!advancedPawnPush &&
				!isPromotion &&
				!isEvasion &&
				!givesCheck &&
				!anyPawnsOn7th &&
				depth >= 3 &&
				bestScore <= alpha) {
				unsigned R = reduction(pvNode, improving, depth, moves_searched);
				LMR -= R;
			}

			score = Score(LMR <= 1 ? -qsearch<non_pv>(pos, -alpha - 1, -alpha, 0, stack + 1) :
				-search<non_pv>(pos, -alpha - 1, -alpha, LMR - 1, stack + 1));

			if (score > alpha) {
				(stack + 1)->pv = pv;
				(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);

				score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
					-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
			}
		}
		++moves_searched;

		if (move.type == Movetype::quiet)
			quiets.emplace_back(move);


		pos.undo_move(move);

		// return if stop requested - do not updated best move or pv
		if (UCI_SIGNALS.stop)
			return Score::draw;


		// root move update
		if (root_node) {
			auto& rm = *std::find(pos.root_moves.begin(), pos.root_moves.end(), move);

			if (moves_searched == 1 || score > alpha) {
				rm.score = score;
				rm.selDepth = selDepth;
				rm.pv.resize(1);
				for (Move* m = (stack + 1)->pv;; ++m) {
					if (m->f == m->t || m->type == Movetype::no_type)
						break;
					rm.pv.push_back(*m);
				}
			}
			else rm.score = Score::ninf;
		}

		if (score > bestScore) {
			bestScore = score;
			best_move = move;
			stack->best_move = move;

			if (score >= beta) {
				// Update mate killers and quiet move stats
				pos.stats_update(best_move,
					(stack - 1)->curr_move,
					depth, bestScore, quiets, stack->killers);
				break;
			}

			if (score > alpha) {

				if (pvNode)
					alpha = score;

				if (pvNode && !root_node)
					update_pv(stack->pv, move, (stack + 1)->pv);
			}
		}


		// Penalize captures failing to raise alpha
		//if (SEE >= 0 && !pv && score < alpha && move.f != move.t && move.type == Movetype::capture) {
		//	auto capturePenalty = 2 * depth;
		//	stack->capHistory[to_mv][move.f][move.t] -= capturePenalty;
		//}

	} // end moves loop




	unset_searching(pos, {});

	// Update best move stats
	auto bestMoveBonus = 2 * depth;
	if (bestScore >= alpha && bestScore < beta && best_move.f != best_move.t) {
		stack->bestMoveHistory->bm[to_mv][best_move.f][best_move.t] += bestMoveBonus;
	}



	if (moves_searched == 0) {
		return (in_check ? Score(Score::mated + root_dist) : Score::draw);
	}

	Bound bound = (bestScore >= beta ? bound_low :
		pvNode && (best_move.type != Movetype::no_type) ? bound_exact : bound_high);
	ttable.save(pos.key(), depth, U8(bound), stack->ply, best_move, bestScore, pvNode);

	return bestScore;
}